

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DExporter::AttrHelper_Color3ToAttrList
          (X3DExporter *this,
          list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
          *pList,string *pName,aiColor3D *pValue,aiColor3D *pDefaultValue)

{
  bool bVar1;
  string tstr;
  undefined1 local_60 [64];
  
  tstr._M_dataplus._M_p = (pointer)&tstr.field_2;
  tstr._M_string_length = 0;
  tstr.field_2._M_local_buf[0] = '\0';
  bVar1 = aiColor3D::operator==(pValue,pDefaultValue);
  if (!bVar1) {
    AttrHelper_Col3DArrToString(this,pValue,1,&tstr);
    std::__cxx11::string::string((string *)local_60,(string *)pName);
    std::__cxx11::string::string((string *)(local_60 + 0x20),(string *)&tstr);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back(pList,(value_type *)local_60);
    SAttribute::~SAttribute((SAttribute *)local_60);
  }
  std::__cxx11::string::~string((string *)&tstr);
  return;
}

Assistant:

void X3DExporter::AttrHelper_Color3ToAttrList(std::list<SAttribute>& pList, const std::string& pName, const aiColor3D& pValue, const aiColor3D& pDefaultValue)
{
string tstr;

	if(pValue == pDefaultValue) return;

	AttrHelper_Col3DArrToString(&pValue, 1, tstr);
	pList.push_back({pName, tstr});
}